

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O1

char * __thiscall
__cxxabiv1::anon_unknown_0::parse_base_unresolved_name<__cxxabiv1::(anonymous_namespace)::Db>
          (anon_unknown_0 *this,char *first,char *last,Db *db)

{
  anon_unknown_0 aVar1;
  long lVar2;
  anon_unknown_0 *paVar3;
  anon_unknown_0 *paVar4;
  anon_unknown_0 *paVar5;
  string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
  *psVar6;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  args;
  basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
  local_50;
  
  if ((long)first - (long)this < 2) {
    return (char *)this;
  }
  aVar1 = *this;
  if (((aVar1 == (anon_unknown_0)0x6f) || (aVar1 == (anon_unknown_0)0x64)) &&
     (this[1] == (anon_unknown_0)0x6e)) {
    paVar5 = this + 2;
    if (aVar1 != (anon_unknown_0)0x6f) {
      paVar4 = paVar5;
      if (paVar5 != (anon_unknown_0 *)first) {
        paVar3 = (anon_unknown_0 *)
                 parse_unresolved_type<__cxxabiv1::(anonymous_namespace)::Db>(paVar5,first,last,db);
        if (paVar3 == paVar5) {
          paVar3 = (anon_unknown_0 *)
                   parse_simple_id<__cxxabiv1::(anonymous_namespace)::Db>(paVar5,first,last,db);
        }
        if ((paVar3 != paVar5) && (*(long *)(last + 8) != *(long *)(last + 0x10))) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::replace((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                     *)(*(long *)(last + 0x10) + -0x40),0,0,"~",1);
          paVar4 = paVar3;
        }
      }
      if (paVar4 == paVar5) {
        return (char *)this;
      }
      return (char *)paVar4;
    }
    paVar3 = (anon_unknown_0 *)
             parse_operator_name<__cxxabiv1::(anonymous_namespace)::Db>
                       ((char *)paVar5,first,(Db *)last);
    if (paVar3 == paVar5) {
      return (char *)this;
    }
    paVar4 = (anon_unknown_0 *)
             parse_template_args<__cxxabiv1::(anonymous_namespace)::Db>(paVar3,first,last,db);
    if (paVar4 == paVar3) {
      return (char *)paVar4;
    }
    if ((ulong)(*(long *)(last + 0x10) - *(long *)(last + 8)) < 0x41) {
      return (char *)paVar4;
    }
    psVar6 = (string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
              *)(*(long *)(last + 0x10) + -0x40);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_50,psVar6);
    lVar2 = *(long *)(last + 0x10);
    *(short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
      **)(last + 0x10) =
         (short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
          *)(lVar2 + -0x40);
    std::
    allocator_traits<__cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>,4096ul>>
    ::
    destroy<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>>
              ((short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
                *)(lVar2 + -0x40),psVar6);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                 *)(*(long *)(last + 0x10) + -0x40),local_50._M_dataplus._M_p,
                local_50._M_string_length);
  }
  else {
    paVar5 = (anon_unknown_0 *)
             parse_simple_id<__cxxabiv1::(anonymous_namespace)::Db>(this,first,last,db);
    if (paVar5 != this) {
      return (char *)paVar5;
    }
    paVar5 = (anon_unknown_0 *)
             parse_operator_name<__cxxabiv1::(anonymous_namespace)::Db>
                       ((char *)this,first,(Db *)last);
    if (paVar5 == this) {
      return (char *)this;
    }
    paVar4 = (anon_unknown_0 *)
             parse_template_args<__cxxabiv1::(anonymous_namespace)::Db>(paVar5,first,last,db);
    if (paVar4 == paVar5) {
      return (char *)paVar4;
    }
    if ((ulong)(*(long *)(last + 0x10) - *(long *)(last + 8)) < 0x41) {
      return (char *)paVar4;
    }
    psVar6 = (string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
              *)(*(long *)(last + 0x10) + -0x40);
    string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>
    ::move_full(&local_50,psVar6);
    lVar2 = *(long *)(last + 0x10);
    *(short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
      **)(last + 0x10) =
         (short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
          *)(lVar2 + -0x40);
    std::
    allocator_traits<__cxxabiv1::(anonymous_namespace)::short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>,4096ul>>
    ::
    destroy<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>>
              ((short_alloc<__cxxabiv1::(anonymous_namespace)::string_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_>,_4096UL>
                *)(lVar2 + -0x40),psVar6);
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::_M_append((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                 *)(*(long *)(last + 0x10) + -0x40),local_50._M_dataplus._M_p,
                local_50._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    free(local_50._M_dataplus._M_p);
  }
  return (char *)paVar4;
}

Assistant:

const char*
parse_base_unresolved_name(const char* first, const char* last, C& db)
{
    if (last - first >= 2)
    {
        if ((first[0] == 'o' || first[0] == 'd') && first[1] == 'n')
        {
            if (first[0] == 'o')
            {
                const char* t = parse_operator_name(first+2, last, db);
                if (t != first+2)
                {
                    first = parse_template_args(t, last, db);
                    if (first != t)
                    {
                        if (db.names.size() < 2)
                            return first;
                        auto args = db.names.back().move_full();
                        db.names.pop_back();
                        db.names.back().first += std::move(args);
                    }
                }
            }
            else
            {
                const char* t = parse_destructor_name(first+2, last, db);
                if (t != first+2)
                    first = t;
            }
        }
        else
        {
            const char* t = parse_simple_id(first, last, db);
            if (t == first)
            {
                t = parse_operator_name(first, last, db);
                if (t != first)
                {
                    first = parse_template_args(t, last, db);
                    if (first != t)
                    {
                        if (db.names.size() < 2)
                            return first;
                        auto args = db.names.back().move_full();
                        db.names.pop_back();
                        db.names.back().first += std::move(args);
                    }
                }
            }
            else
                first = t;
        }
    }
    return first;
}